

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

int megumax::eval(Position *pos)

{
  value_type vVar1;
  int iVar2;
  PieceType pt;
  MetaValueType<int> MVar3;
  int iVar4;
  value_type vVar5;
  value_type vVar6;
  Position *in_RDI;
  int p;
  Square piece_sq;
  Bitboard piece_bb;
  PieceType piece_type;
  PieceType *__end2;
  PieceType *__begin2;
  PieceType (*__range2) [6];
  Color color;
  Color *__end1;
  Color *__begin1;
  Color (*__range1) [2];
  int eg_score;
  int mg_score;
  int score;
  Bitboard *in_stack_ffffffffffffff58;
  Square in_stack_ffffffffffffff60;
  MetaValueType<int> local_94;
  undefined4 in_stack_ffffffffffffff70;
  Square in_stack_ffffffffffffff74;
  Color in_stack_ffffffffffffff78;
  Square in_stack_ffffffffffffff7c;
  Bitboard in_stack_ffffffffffffffa0;
  MetaValueType<int> local_54;
  value_type *local_50;
  value_type *local_48;
  undefined4 *local_40;
  undefined4 local_34;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  int local_14;
  int local_10;
  int local_c;
  Position *local_8;
  
  local_c = 0;
  local_10 = 0;
  local_14 = 0;
  local_20 = &libchess::constants::COLORS;
  local_30 = (undefined4 *)&DAT_0013a4cc;
  local_8 = in_RDI;
  for (local_28 = &libchess::constants::COLORS; local_28 != local_30; local_28 = local_28 + 1) {
    local_34 = *local_28;
    local_40 = &libchess::constants::PIECE_TYPES;
    local_50 = &libchess::constants::WHITE;
    for (local_48 = &libchess::constants::PIECE_TYPES; local_48 != local_50; local_48 = local_48 + 1
        ) {
      local_54.value_ = *local_48;
      in_stack_ffffffffffffffa0 =
           libchess::Position::piece_type_bb
                     ((Position *)
                      CONCAT44(in_stack_ffffffffffffff74.super_MetaValueType<int>.value_,
                               in_stack_ffffffffffffff70),
                      (PieceType)in_stack_ffffffffffffff7c.super_MetaValueType<int>.value_,
                      in_stack_ffffffffffffff78);
      vVar1 = libchess::MetaValueType<int>::value(&local_54);
      iVar4 = *(int *)(piece_values + (long)vVar1 * 4);
      iVar2 = libchess::Bitboard::popcount((Bitboard *)&stack0xffffffffffffffa0);
      local_c = iVar4 * iVar2 + local_c;
      while (vVar6 = libchess::Bitboard::operator_cast_to_unsigned_long
                               ((Bitboard *)&stack0xffffffffffffffa0), vVar6 != 0) {
        libchess::Bitboard::forward_bitscan(in_stack_ffffffffffffff58);
        libchess::Bitboard::forward_popbit((Bitboard *)&stack0xffffffffffffffa0);
        pt.super_MetaValueType<int>.value_ =
             (MetaValueType<int>)
             libchess::MetaValueType::operator_cast_to_int((MetaValueType *)&local_34);
        MVar3.value_ = libchess::MetaValueType::operator_cast_to_int
                                 ((MetaValueType *)&libchess::constants::WHITE);
        if (pt.super_MetaValueType<int>.value_ == (MetaValueType<int>)MVar3.value_) {
          iVar4 = pst_mg(pt,in_stack_ffffffffffffff60);
          local_10 = iVar4 + local_10;
          iVar4 = pst_eg(pt,in_stack_ffffffffffffff60);
          local_14 = iVar4 + local_14;
        }
        else {
          in_stack_ffffffffffffff7c = libchess::Square::flipped((Square *)in_stack_ffffffffffffff58)
          ;
          iVar4 = pst_mg(pt,in_stack_ffffffffffffff60);
          local_10 = iVar4 + local_10;
          in_stack_ffffffffffffff78.super_MetaValueType<int>.value_ =
               (MetaValueType<int>)(MetaValueType<int>)local_54.value_;
          in_stack_ffffffffffffff74 = libchess::Square::flipped((Square *)in_stack_ffffffffffffff58)
          ;
          iVar4 = pst_eg(pt,in_stack_ffffffffffffff60);
          local_14 = iVar4 + local_14;
        }
      }
    }
    local_c = -local_c;
    local_10 = -local_10;
    local_14 = -local_14;
  }
  iVar4 = phase((Position *)in_stack_ffffffffffffffa0.value_);
  local_c = (local_10 * (0x100 - iVar4) + local_14 * iVar4) / 0x100 + local_c;
  local_94.value_ = (value_type)libchess::Position::side_to_move(local_8);
  vVar1 = libchess::MetaValueType::operator_cast_to_int((MetaValueType *)&local_94);
  vVar5 = libchess::MetaValueType::operator_cast_to_int
                    ((MetaValueType *)&libchess::constants::WHITE);
  if (vVar1 != vVar5) {
    local_c = -local_c;
  }
  return local_c;
}

Assistant:

int eval(const Position& pos) {
    int score = 0;
    int mg_score = 0;
    int eg_score = 0;

    for (Color color : constants::COLORS) {
        for (PieceType piece_type : constants::PIECE_TYPES) {
            Bitboard piece_bb = pos.piece_type_bb(piece_type, color);

            // Material
            score += piece_values[piece_type.value()] * piece_bb.popcount();

            while (piece_bb) {
                Square piece_sq = piece_bb.forward_bitscan();
                piece_bb.forward_popbit();

                // PST
                if (color == constants::WHITE) {
                    mg_score += pst_mg(piece_type, piece_sq);
                    eg_score += pst_eg(piece_type, piece_sq);
                } else {
                    mg_score += pst_mg(piece_type, piece_sq.flipped());
                    eg_score += pst_eg(piece_type, piece_sq.flipped());
                }
            }
        }

        score = -score;
        mg_score = -mg_score;
        eg_score = -eg_score;
    }

    // Phase
    const int p = phase(pos);
    score += ((mg_score * (256 - p)) + (eg_score * p)) / 256;

    // Return from side to move's pov
    if (pos.side_to_move() != constants::WHITE) {
        score = -score;
    }

    return score;
}